

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O1

YSRESULT __thiscall YsSoundPlayer::SoundData::ConvertToStereo(SoundData *this)

{
  uint uVar1;
  uchar *puVar2;
  uchar *puVar3;
  ulong uVar4;
  YSRESULT YVar5;
  
  YVar5 = YSOK;
  if (this->stereo != YSTRUE) {
    if (this->bit == 0x10) {
      uVar1 = this->sizeInBytes;
      puVar3 = (uchar *)operator_new__((ulong)(uVar1 * 2));
      if ((ulong)uVar1 != 0) {
        puVar2 = this->dat;
        uVar4 = 0;
        do {
          puVar3[uVar4 * 2] = puVar2[uVar4];
          puVar3[uVar4 * 2 + 1] = puVar2[uVar4 + 1];
          puVar3[uVar4 * 2 + 2] = puVar2[uVar4];
          puVar3[uVar4 * 2 + 3] = puVar2[uVar4 + 1];
          uVar4 = uVar4 + 2;
        } while (uVar4 < uVar1);
      }
      this->dat = puVar3;
      this->stereo = YSTRUE;
      this->sizeInBytes = uVar1 * 2;
    }
    else {
      YVar5 = YSERR;
      if (this->bit == 8) {
        uVar1 = this->sizeInBytes;
        puVar3 = (uchar *)operator_new__((ulong)(uVar1 * 2));
        if ((ulong)uVar1 != 0) {
          puVar2 = this->dat;
          uVar4 = 0;
          do {
            puVar3[uVar4 * 2] = puVar2[uVar4];
            puVar3[uVar4 * 2 + 1] = puVar2[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        if (this->dat != (uchar *)0x0) {
          operator_delete__(this->dat);
        }
        this->dat = puVar3;
        this->stereo = YSTRUE;
        this->sizeInBytes = this->sizeInBytes << 1;
        YVar5 = YSOK;
      }
    }
  }
  return YVar5;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::ConvertToStereo(void)
{
	if(stereo==YSTRUE)
	{
		return YSOK;
	}
	else
	{
		if(bit==8)
		{
			unsigned char *newDat=new unsigned char [sizeInBytes*2];
			for(int i=0; i<sizeInBytes; i++)
			{
				newDat[i*2  ]=dat[i];
				newDat[i*2+1]=dat[i];
			}
			delete [] dat;
			dat=newDat;
			stereo=YSTRUE;
			sizeInBytes*=2;
			return YSOK;
		}
		else if(bit==16)
		{
			unsigned char *newDat=new unsigned char [sizeInBytes*2];
			for(int i=0; i<sizeInBytes; i+=2)
			{
				newDat[i*2  ]=dat[i];
				newDat[i*2+1]=dat[i+1];
				newDat[i*2+2]=dat[i];
				newDat[i*2+3]=dat[i+1];
			}
			dat=newDat;
			stereo=YSTRUE;
			sizeInBytes*=2;
			return YSOK;
		}
	}
	return YSERR;
}